

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O1

int upsample(double *x,int lenx,int M,double *y)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  
  if (M < 0) {
    lenx = -1;
  }
  else if (M == 0) {
    if (0 < lenx) {
      uVar2 = 0;
      do {
        y[uVar2] = x[uVar2];
        uVar2 = uVar2 + 1;
      } while ((uint)lenx != uVar2);
    }
  }
  else {
    iVar1 = (lenx + -1) * M;
    lenx = iVar1 + 1;
    if (-1 < iVar1) {
      iVar4 = 1;
      uVar2 = 0;
      iVar3 = 0;
      do {
        y[uVar2] = 0.0;
        iVar4 = iVar4 + -1;
        if (iVar4 == 0) {
          y[uVar2] = x[iVar3];
          iVar3 = iVar3 + 1;
          iVar4 = M;
        }
        uVar2 = uVar2 + 1;
      } while (iVar1 + 1 != uVar2);
    }
  }
  return lenx;
}

Assistant:

int upsample(double *x,int lenx, int M, double *y) {
	int N,i,j,k;

	if (M < 0) {
		return -1;
	}

	if (M == 0) {
		for (i = 0; i < lenx; ++i) {
			y[i] = x[i];
		}
		return lenx;
	}

	N = M * (lenx-1) + 1;
	j = 1;
	k = 0;

	for(i = 0; i < N;++i) {
		j--;
		y[i] = 0.0;
		if (j == 0) {
			y[i] = x[k];
			k++;
			j = M;
		}
	}

	return N;
}